

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char sqlite3CompareAffinity(Expr *pExpr,char aff2)

{
  char cVar1;
  char aff1;
  char aff2_local;
  Expr *pExpr_local;
  
  cVar1 = sqlite3ExprAffinity(pExpr);
  if ((cVar1 == '\0') || (aff2 == '\0')) {
    if ((cVar1 == '\0') && (aff2 == '\0')) {
      pExpr_local._7_1_ = 'b';
    }
    else {
      pExpr_local._7_1_ = cVar1 + aff2;
    }
  }
  else if ((cVar1 < 'c') && (aff2 < 'c')) {
    pExpr_local._7_1_ = 'b';
  }
  else {
    pExpr_local._7_1_ = 'c';
  }
  return pExpr_local._7_1_;
}

Assistant:

SQLITE_PRIVATE char sqlite3CompareAffinity(Expr *pExpr, char aff2){
  char aff1 = sqlite3ExprAffinity(pExpr);
  if( aff1 && aff2 ){
    /* Both sides of the comparison are columns. If one has numeric
    ** affinity, use that. Otherwise use no affinity.
    */
    if( sqlite3IsNumericAffinity(aff1) || sqlite3IsNumericAffinity(aff2) ){
      return SQLITE_AFF_NUMERIC;
    }else{
      return SQLITE_AFF_NONE;
    }
  }else if( !aff1 && !aff2 ){
    /* Neither side of the comparison is a column.  Compare the
    ** results directly.
    */
    return SQLITE_AFF_NONE;
  }else{
    /* One side is a column, the other is not. Use the columns affinity. */
    assert( aff1==0 || aff2==0 );
    return (aff1 + aff2);
  }
}